

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::expand
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_t capacity)

{
  long lVar1;
  long *plVar2;
  size_t *psVar3;
  size_t *psVar4;
  long *plVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  
  uVar6 = capacity << 5;
  psVar3 = (size_t *)operator_new__(-(ulong)(capacity >> 0x3b != 0) | uVar6 | 8);
  *psVar3 = capacity;
  if (capacity != 0) {
    psVar4 = psVar3 + 3;
    do {
      psVar4[-2] = (size_t)psVar4;
      psVar4[-1] = 0;
      *(undefined1 *)psVar4 = 0;
      psVar4 = psVar4 + 4;
      uVar6 = uVar6 - 0x20;
    } while (uVar6 != 0);
  }
  if (this->mSize != 0) {
    uVar6 = 0;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar3 + 1);
    do {
      std::__cxx11::string::_M_assign((string *)pbVar7);
      uVar6 = uVar6 + 1;
      pbVar7 = pbVar7 + 1;
    } while (uVar6 < this->mSize);
  }
  pbVar7 = this->mData;
  if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar1 = *(long *)((long)&pbVar7[-1].field_2 + 8);
    if (lVar1 != 0) {
      lVar8 = lVar1 << 5;
      do {
        plVar5 = (long *)((long)pbVar7 + lVar8 + -0x10);
        plVar2 = *(long **)((long)&pbVar7[-1]._M_dataplus._M_p + lVar8);
        if (plVar5 != plVar2) {
          operator_delete(plVar2,*plVar5 + 1);
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != 0);
    }
    operator_delete__((void *)((long)&pbVar7[-1].field_2 + 8),lVar1 << 5 | 8);
  }
  this->mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar3 + 1);
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }